

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

Array<char> * __thiscall asl::Array<char>::append(Array<char> *this,Array<char> *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int local_20;
  int i;
  int n;
  Array<char> *b_local;
  Array<char> *this_local;
  
  iVar1 = length(this);
  iVar2 = length(this);
  iVar3 = length(b);
  resize(this,iVar2 + iVar3);
  local_20 = 0;
  while( true ) {
    iVar2 = length(b);
    if (iVar2 <= local_20) break;
    pcVar4 = operator[](b,local_20);
    this->_a[iVar1 + local_20] = *pcVar4;
    local_20 = local_20 + 1;
  }
  return this;
}

Assistant:

Array& append(const Array& b)
	{
		int n=length();
		resize(length()+b.length());
		for (int i=0; i<b.length(); i++)
			_a[n+i] = b[i];
		return *this;
	}